

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O3

OptimizerResult
TasGrid::Optimizer::computeLocalMaximum<(TasGrid::TypeOneDRule)20>
          (CurrentNodes<(TasGrid::TypeOneDRule)20> *current,double left_node,double right_node)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double x;
  double dVar6;
  OptimizerResult OVar7;
  double local_50;
  double local_30;
  
  local_50 = (right_node - left_node) * 0.5;
  dVar1 = getValue<(TasGrid::TypeOneDRule)20>(current,left_node);
  dVar2 = getValue<(TasGrid::TypeOneDRule)20>(current,local_50 + left_node);
  dVar3 = getValue<(TasGrid::TypeOneDRule)20>(current,right_node);
  dVar4 = local_50 + left_node;
  dVar5 = left_node;
  local_30 = right_node;
joined_r0x001c8431:
  do {
    while( true ) {
      dVar6 = dVar2;
      dVar2 = dVar1;
      if (local_50 <= 1e-15) {
        OVar7 = performSecantSearch<(TasGrid::TypeOneDRule)20>(current,dVar5,local_30);
        dVar4 = getValue<(TasGrid::TypeOneDRule)20>(current,OVar7.node);
        OVar7.value = dVar4;
        return OVar7;
      }
      dVar1 = dVar3;
      if (dVar3 <= dVar2) {
        dVar1 = dVar2;
      }
      if (dVar6 < dVar1) break;
      dVar5 = dVar4 - local_50 * 0.5;
      dVar1 = getValue<(TasGrid::TypeOneDRule)20>(current,dVar5);
      local_30 = dVar4 + local_50 * 0.5;
      dVar3 = getValue<(TasGrid::TypeOneDRule)20>(current,local_30);
      dVar2 = dVar6;
LAB_001c8552:
      local_50 = local_50 * 0.5;
    }
    dVar1 = dVar3;
    if (dVar3 <= dVar6) {
      dVar1 = dVar6;
    }
    if (dVar2 < dVar1) {
      dVar2 = local_30 + local_50;
      dVar1 = dVar6;
      dVar5 = dVar4;
      if (right_node < dVar2) {
        dVar4 = local_30 - local_50 * 0.5;
        dVar2 = getValue<(TasGrid::TypeOneDRule)20>(current,dVar4);
        goto LAB_001c8552;
      }
      dVar6 = getValue<(TasGrid::TypeOneDRule)20>(current,dVar2);
      dVar4 = local_30;
      local_30 = dVar2;
      dVar2 = dVar3;
      dVar3 = dVar6;
      goto joined_r0x001c8431;
    }
    x = dVar5 - local_50;
    local_30 = dVar4;
    dVar3 = dVar6;
    if (left_node <= x) {
      dVar1 = getValue<(TasGrid::TypeOneDRule)20>(current,x);
      dVar4 = dVar5;
      dVar5 = x;
    }
    else {
      local_50 = local_50 * 0.5;
      dVar6 = getValue<(TasGrid::TypeOneDRule)20>(current,dVar5 + local_50);
      dVar4 = dVar5 + local_50;
      dVar1 = dVar2;
      dVar2 = dVar6;
    }
  } while( true );
}

Assistant:

OptimizerResult computeLocalMaximum(CurrentNodes<rule> const& current, double left_node, double right_node){
    auto func = [&](double x)->OptimizerResult{ return {x, getValue<rule>(current, x)}; };

    double pattern = 0.5 * (right_node - left_node); // pattern width
    OptimizerResult left   = func(left_node);
    OptimizerResult middle = func(left_node + pattern);
    OptimizerResult right  = func(right_node);

    // if differentiable, use coarse tolerance since we will post-process.
    double tolerance = (HasDerivative<rule>::value) ? Maths::num_tol * 1.E-3 : Maths::num_tol;

    while(pattern > tolerance){
        if (middle.value >= std::max(left.value, right.value)){ // middle is largest, shrink
            pattern /= 2.0;
            left  = func(middle.node - pattern);
            right = func(middle.node + pattern);
        }else if (left.value >= std::max(middle.value, right.value)){ // left is the largest
            if (left.node - pattern < left_node){ // if going out of bounds
                pattern /= 2.0;
                right  = middle;
                middle = func(left.node + pattern);
            }else{ // shift left
                right  = middle;
                middle = left;
                left  = func(middle.node - pattern);
            }
        }else{ // right must be the largest
            if (right.node + pattern > right_node){ // if going out of bounds
                pattern /= 2.0;
                left   = middle;
                middle = func(right.node - pattern);
            }else{ // shift right
                left   = middle;
                middle = right;
                right  = func(middle.node + pattern);
            }
        }
    }

    if (HasDerivative<rule>::value){
        middle = performSecantSearch(current, left.node, right.node); // this returns the derivative
        middle = func(middle.node);
    }

    return middle;
}